

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

void __thiscall soul::Program::Program(Program *this,ProgramImpl *p,bool holdRef)

{
  RefCountedPtr<soul::Program::ProgramImpl> local_28;
  byte local_19;
  ProgramImpl *pPStack_18;
  bool holdRef_local;
  ProgramImpl *p_local;
  Program *this_local;
  
  this->pimpl = p;
  local_19 = holdRef;
  pPStack_18 = p;
  p_local = (ProgramImpl *)this;
  RefCountedPtr<soul::Program::ProgramImpl>::RefCountedPtr(&this->refHolder);
  if ((local_19 & 1) != 0) {
    RefCountedPtr<soul::Program::ProgramImpl>::RefCountedPtr(&local_28,pPStack_18);
    RefCountedPtr<soul::Program::ProgramImpl>::operator=(&this->refHolder,&local_28);
    RefCountedPtr<soul::Program::ProgramImpl>::~RefCountedPtr(&local_28);
  }
  return;
}

Assistant:

Program::Program (ProgramImpl& p, bool holdRef) : pimpl (&p) { if (holdRef) refHolder = p; }